

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O3

result_type_conflict2 __thiscall
trng::gamma_dist<double>::icdf(gamma_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  result_type_conflict2 rVar2;
  double dVar3;
  
  rVar2 = 0.0;
  if ((x <= 0.0) || (1.0 <= x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    rVar2 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      dVar3 = math::detail::inv_GammaP<double>((this->P).kappa_,x);
      rVar2 = dVar3 * (this->P).theta_;
    }
    else {
      rVar2 = INFINITY;
    }
  }
  return rVar2;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }